

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

shared_ptr<kratos::FunctionCallStmt> *
kratos::FSM::get_func_call_stmt
          (shared_ptr<kratos::FunctionStmtBlock> *func_def,FSMState *fsm_state,
          shared_ptr<kratos::FunctionCallStmt> *func_stmt)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  size_t *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<kratos::FunctionCallStmt> *psVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  size_type *psVar7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  undefined1 local_c8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  mapping;
  shared_ptr<kratos::Var> var_to_;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_78;
  shared_ptr<kratos::FunctionStmtBlock> *local_68;
  shared_ptr<kratos::FunctionCallStmt> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&mapping;
  mapping._M_t._M_impl._0_4_ = 0;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p_Var6 = (fsm_state->output_values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(fsm_state->output_values_)._M_t._M_impl.super__Rb_tree_header;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_68 = func_def;
  local_60 = func_stmt;
  if ((_Rb_tree_header *)p_Var6 != p_Var9) {
    this = &mapping._M_t._M_impl.super__Rb_tree_header._M_node_count;
    p_Var1 = &var_to_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    do {
      p_Var8 = p_Var6[1]._M_parent;
      if (p_Var8 == (_Base_ptr)0x0) {
        p_Var8 = *(_Base_ptr *)(p_Var6 + 1);
      }
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)&p_Var8[3]._M_parent);
      (**(code **)(**(long **)(p_Var6 + 1) + 0xf8))(p_Var1);
      plVar5 = (long *)std::__cxx11::string::append((char *)p_Var1);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_58.field_2._M_allocated_capacity = *psVar7;
        local_58.field_2._8_8_ = plVar5[3];
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      }
      else {
        local_58.field_2._M_allocated_capacity = *psVar7;
        local_58._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_58._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
      ::_M_emplace_unique<std::__cxx11::string,std::shared_ptr<kratos::Var>&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                  *)local_c8,&local_58,(shared_ptr<kratos::Var> *)this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (var_to_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          &local_78) {
        operator_delete(var_to_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,(long)local_78._vptr__Sp_counted_base + 1);
      }
      if (var_to_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   var_to_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var9);
  }
  local_58._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::FunctionCallStmt,std::allocator<kratos::FunctionCallStmt>,std::shared_ptr<kratos::FunctionStmtBlock>const&,std::map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length,
             (FunctionCallStmt **)&local_58,
             (_Sp_alloc_shared_tag<std::allocator<kratos::FunctionCallStmt>_>)
             &var_to_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             local_68,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                       *)local_c8);
  std::__shared_ptr<kratos::FunctionCallStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::FunctionCallStmt,kratos::FunctionCallStmt>
            ((__shared_ptr<kratos::FunctionCallStmt,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (FunctionCallStmt *)local_58._M_dataplus._M_p);
  sVar4 = local_58._M_string_length;
  _Var3._M_p = local_58._M_dataplus._M_p;
  psVar2 = local_60;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  this_00 = (local_60->super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  (local_60->super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)_Var3._M_p;
  (local_60->super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
               *)local_c8);
  return psVar2;
}

Assistant:

std::shared_ptr<FunctionCallStmt>& FSM::get_func_call_stmt(
    const std::shared_ptr<FunctionStmtBlock>& func_def, const FSMState* fsm_state,
    std::shared_ptr<FunctionCallStmt>& func_stmt) {
    // get arg mapping
    std::map<std::string, std::shared_ptr<Var>> mapping;
    auto const& output_values = fsm_state->output_values();
    for (auto const& [var_from, var_to] : output_values) {
        std::shared_ptr<Var> var_to_ =
            var_to ? var_to->shared_from_this() : var_from->shared_from_this();
        mapping.emplace(var_from->to_string() + "_value", var_to_);
    }
    func_stmt = std::make_shared<FunctionCallStmt>(func_def, mapping);
    return func_stmt;
}